

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qlist.h
# Opt level: O0

iterator __thiscall QList<bool_(*)(void_**)>::end(QList<bool_(*)(void_**)> *this)

{
  _func_bool_void_ptr_ptr **n;
  QArrayDataPointer<bool_(*)(void_**)> *in_RDI;
  long in_FS_OFFSET;
  QArrayDataPointer<bool_(*)(void_**)> *in_stack_ffffffffffffffe0;
  iterator local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  detach((QList<bool_(*)(void_**)> *)0x235a99);
  QArrayDataPointer<bool_(*)(void_**)>::operator->(in_RDI);
  n = QArrayDataPointer<bool_(*)(void_**)>::end(in_stack_ffffffffffffffe0);
  iterator::iterator(&local_10,n);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_8) {
    return (iterator)local_10.i;
  }
  __stack_chk_fail();
}

Assistant:

iterator end() { detach(); return iterator(d->end()); }